

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

int push_const_val(c2m_ctx_t c2m_ctx,node_t_conflict r,op_t *res)

{
  MIR_op_t mir_op;
  MIR_op_t mir_op_00;
  MIR_context_t pMVar1;
  int iVar2;
  MIR_op_t local_128;
  op_t local_f8;
  MIR_op_t local_b8;
  op_t local_88;
  MIR_type_t local_3c;
  byte *pbStack_38;
  MIR_type_t mir_type;
  expr_conflict *e;
  MIR_context_t ctx;
  op_t *res_local;
  node_t_conflict r_local;
  c2m_ctx_t c2m_ctx_local;
  
  e = (expr_conflict *)c2m_ctx->ctx;
  pbStack_38 = (byte *)r->attr;
  if ((*pbStack_38 & 1) == 0) {
    c2m_ctx_local._4_4_ = 0;
  }
  else {
    ctx = (MIR_context_t)res;
    res_local = (op_t *)r;
    r_local = (node_t_conflict)c2m_ctx;
    iVar2 = floating_type_p(*(type **)(pbStack_38 + 0x18));
    if (iVar2 == 0) {
      iVar2 = integer_type_p(*(type **)(pbStack_38 + 0x18));
      pMVar1 = ctx;
      if ((iVar2 == 0) && (*(int *)(*(long *)(pbStack_38 + 0x18) + 0x18) != 3)) {
        __assert_fail("integer_type_p (e->type) || e->type->mode == TM_PTR",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                      ,0x28d6,"int push_const_val(c2m_ctx_t, node_t, op_t *)");
      }
      iVar2 = signed_integer_type_p(*(type **)(pbStack_38 + 0x18));
      if (iVar2 == 0) {
        MIR_new_uint_op(&local_128,(MIR_context_t)e,*(uint64_t *)(pbStack_38 + 0x30));
      }
      else {
        MIR_new_int_op(&local_128,(MIR_context_t)e,*(int64_t *)(pbStack_38 + 0x30));
      }
      mir_op_00._8_2_ = local_128._8_2_;
      mir_op_00.data = local_128.data;
      mir_op_00._10_6_ = local_128._10_6_;
      mir_op_00.u.i = local_128.u.i;
      mir_op_00.u.str.s = local_128.u.str.s;
      mir_op_00.u._16_8_ = local_128.u._16_8_;
      mir_op_00.u.mem.disp = local_128.u.mem.disp;
      new_op(&local_f8,(decl_t)0x0,mir_op_00);
      memcpy(pMVar1,&local_f8,0x40);
    }
    else {
      local_3c = get_mir_type((c2m_ctx_t)r_local,*(type **)(pbStack_38 + 0x18));
      pMVar1 = ctx;
      if (local_3c == MIR_T_F) {
        MIR_new_float_op(&local_b8,(MIR_context_t)e,(float)*(longdouble *)(pbStack_38 + 0x30));
      }
      else if (local_3c == MIR_T_D) {
        MIR_new_double_op(&local_b8,(MIR_context_t)e,(double)*(longdouble *)(pbStack_38 + 0x30));
      }
      else {
        MIR_new_ldouble_op(&local_b8,(MIR_context_t)e,*(longdouble *)(pbStack_38 + 0x30));
      }
      mir_op._8_2_ = local_b8._8_2_;
      mir_op.data = local_b8.data;
      mir_op._10_6_ = local_b8._10_6_;
      mir_op.u.i = local_b8.u.i;
      mir_op.u.str.s = local_b8.u.str.s;
      mir_op.u._16_8_ = local_b8.u._16_8_;
      mir_op.u.mem.disp = local_b8.u.mem.disp;
      new_op(&local_88,(decl_t)0x0,mir_op);
      memcpy(pMVar1,&local_88,0x40);
    }
    c2m_ctx_local._4_4_ = 1;
  }
  return c2m_ctx_local._4_4_;
}

Assistant:

static int push_const_val (c2m_ctx_t c2m_ctx, node_t r, op_t *res) {
  MIR_context_t ctx = c2m_ctx->ctx;
  struct expr *e = (struct expr *) r->attr;
  MIR_type_t mir_type;

  if (!e->const_p) return FALSE;
  if (floating_type_p (e->type)) {
    /* MIR support only IEEE float and double */
    mir_type = get_mir_type (c2m_ctx, e->type);
    *res = new_op (NULL, (mir_type == MIR_T_F   ? MIR_new_float_op (ctx, (float) e->c.d_val)
                          : mir_type == MIR_T_D ? MIR_new_double_op (ctx, e->c.d_val)
                                                : MIR_new_ldouble_op (ctx, e->c.d_val)));
  } else {
    assert (integer_type_p (e->type) || e->type->mode == TM_PTR);
    *res = new_op (NULL, (signed_integer_type_p (e->type) ? MIR_new_int_op (ctx, e->c.i_val)
                                                          : MIR_new_uint_op (ctx, e->c.u_val)));
  }
  return TRUE;
}